

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalarN
               (char *label,ImGuiDataType data_type,void *v,int components,void *v_min,void *v_max,
               char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  float in_ECX;
  char *in_RDI;
  char *label_end;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiTextFlags in_stack_000000b4;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  char *in_stack_00000160;
  void *in_stack_00000168;
  void *in_stack_00000170;
  void *in_stack_00000178;
  ImGuiDataType in_stack_00000184;
  char *in_stack_00000188;
  ImGuiSliderFlags in_stack_000001a0;
  float in_stack_ffffffffffffff90;
  float offset_from_start_x;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int int_id;
  float in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  byte bVar4;
  bool local_1;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
    BeginGroup();
    PushID((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    offset_from_start_x = in_ECX;
    CalcItemWidth();
    PushMultiItemsWidths(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    for (int_id = 0; bVar4 = (byte)(in_stack_ffffffffffffffb4 >> 0x18), int_id < (int)in_ECX;
        int_id = int_id + 1) {
      PushID(int_id);
      if (0 < int_id) {
        SameLine(offset_from_start_x,in_stack_ffffffffffffff90);
      }
      bVar1 = SliderScalar(in_stack_00000188,in_stack_00000184,in_stack_00000178,in_stack_00000170,
                           in_stack_00000168,in_stack_00000160,in_stack_000001a0);
      in_stack_ffffffffffffffb4 =
           (uint)((in_stack_ffffffffffffffb4 & 0x1000000) != 0 || bVar1) << 0x18;
      PopID();
      PopItemWidth();
    }
    PopID();
    pcVar3 = FindRenderedTextEnd(in_RDI,(char *)0x0);
    if (in_RDI != pcVar3) {
      SameLine(offset_from_start_x,in_stack_ffffffffffffff90);
      TextEx(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
    }
    EndGroup();
    local_1 = (bool)(bVar4 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* v_min, const void* v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= SliderScalar("", data_type, v, v_min, v_max, format, flags);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}